

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_8::ComputeRegisterLiveness::DoLoopLivenessUnification
          (ComputeRegisterLiveness *this,Loop *loop)

{
  RegisterLiveness *pRVar1;
  IRContext *context;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __first;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __first_00;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __first_01;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __first_02;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __last;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __last_00;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __last_01;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __last_02;
  ComputeRegisterLiveness *this_00;
  bool bVar2;
  BasicBlockListTy *pBVar3;
  BasicBlock *pBVar4;
  RegionRegisterLiveness *pRVar5;
  reference pvVar6;
  LiveSet *pLVar7;
  reference ppLVar8;
  BasicBlock *in_R9;
  anon_class_16_2_3f78c113_for_predicate_ predicate_00;
  ExcludePhiDefinedInBlock predicate_01;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  local_278;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  local_258;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  local_238;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  local_218;
  RegionRegisterLiveness *local_1f8;
  RegionRegisterLiveness *live_inout_1;
  Loop *inner_loop;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  Loop *__range3_1;
  _Node_iterator<spvtools::opt::Instruction_*,_true,_false> local_1c8;
  IRContext *local_1c0;
  BasicBlock *local_1b8;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  local_1b0;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  local_190;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  local_170;
  RegionRegisterLiveness *local_150;
  RegionRegisterLiveness *live_inout;
  BasicBlock *bb;
  undefined1 local_138 [4];
  uint32_t bb_id;
  FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>
  __end3;
  FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>
  __begin3;
  Range *__range3;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_e0;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_d8;
  undefined1 local_d0 [8];
  Range live_loop;
  ExcludePhiDefinedInBlock predicate;
  RegionRegisterLiveness *header_live_inout;
  _Node_iterator_base<unsigned_int,_false> local_68;
  _Node_iterator_base<unsigned_int,_false> local_60;
  undefined1 local_58 [8];
  Range blocks_in_loop;
  Loop *loop_local;
  ComputeRegisterLiveness *this_local;
  
  blocks_in_loop.end_.predicate_.this = (ComputeRegisterLiveness *)loop;
  pBVar3 = Loop::GetBlocks(loop);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::begin(pBVar3);
  pBVar3 = Loop::GetBlocks((Loop *)blocks_in_loop.end_.predicate_.this);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(pBVar3);
  predicate_00.this = (ComputeRegisterLiveness *)in_R9;
  predicate_00.loop = (Loop *)this;
  MakeFilterIteratorRange<std::__detail::_Node_const_iterator<unsigned_int,true,false>,spvtools::opt::(anonymous_namespace)::ComputeRegisterLiveness::DoLoopLivenessUnification(spvtools::opt::Loop_const&)::_lambda(unsigned_int)_1_>
            ((Range *)local_58,(opt *)&local_60,
             (_Node_const_iterator<unsigned_int,_true,_false> *)&local_68,
             (_Node_const_iterator<unsigned_int,_true,_false> *)blocks_in_loop.end_.predicate_.this,
             predicate_00);
  pRVar1 = this->reg_pressure_;
  pBVar4 = Loop::GetHeaderBlock((Loop *)blocks_in_loop.end_.predicate_.this);
  pRVar5 = RegisterLiveness::Get(pRVar1,pBVar4);
  if (pRVar5 == (RegionRegisterLiveness *)0x0) {
    __assert_fail("header_live_inout && \"Liveness analysis was not performed for the current block\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp"
                  ,0xb7,
                  "void spvtools::opt::(anonymous namespace)::ComputeRegisterLiveness::DoLoopLivenessUnification(const Loop &)"
                 );
  }
  context = this->context_;
  pBVar4 = Loop::GetHeaderBlock((Loop *)blocks_in_loop.end_.predicate_.this);
  ExcludePhiDefinedInBlock::ExcludePhiDefinedInBlock
            ((ExcludePhiDefinedInBlock *)&live_loop.end_.predicate_.bb_,context,pBVar4);
  local_d8._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::begin(&pRVar5->live_in_);
  local_e0._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::end(&pRVar5->live_in_);
  predicate_01.bb_ = in_R9;
  predicate_01.context_ = predicate.context_;
  MakeFilterIteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
            ((Range *)local_d0,(opt *)&local_d8,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_e0,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)
             live_loop.end_.predicate_.bb_,predicate_01);
  IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp:175:9)>_>
  ::begin((FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>
           *)&__end3.predicate_.this,
          (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>_>
           *)local_58);
  IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp:175:9)>_>
  ::end((FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>
         *)local_138,
        (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>_>
         *)local_58);
  while (bVar2 = FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp:175:9)>
                 ::operator!=((FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>
                               *)&__end3.predicate_.this,
                              (FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>
                               *)local_138), this_00 = blocks_in_loop.end_.predicate_.this, bVar2) {
    pvVar6 = FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp:175:9)>
             ::operator*((FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>
                          *)&__end3.predicate_.this);
    bb._4_4_ = *pvVar6;
    live_inout = (RegionRegisterLiveness *)CFG::block(this->cfg_,bb._4_4_);
    pRVar5 = RegisterLiveness::Get(this->reg_pressure_,(BasicBlock *)live_inout);
    local_150 = pRVar5;
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
    ::begin(&local_170,
            (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
             *)local_d0);
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
    ::end(&local_190,
          (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
           *)local_d0);
    __first.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_170.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_170.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first.predicate_.context_ = local_170.predicate_.context_;
    __first.predicate_.bb_ = local_170.predicate_.bb_;
    __last.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_190.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_190.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last.predicate_.context_ = local_190.predicate_.context_;
    __last.predicate_.bb_ = local_190.predicate_.bb_;
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::
    insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)pRVar5,__first,__last);
    pLVar7 = &local_150->live_out_;
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
    ::begin(&local_1b0,
            (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
             *)local_d0);
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
    ::end((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
           *)&__range3_1,
          (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
           *)local_d0);
    __first_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_1b0.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_1b0.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_00.predicate_.context_ = local_1b0.predicate_.context_;
    __first_00.predicate_.bb_ = local_1b0.predicate_.bb_;
    __last_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_1c8.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
         (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)__range3_1;
    __last_00.predicate_.context_ = local_1c0;
    __last_00.predicate_.bb_ = local_1b8;
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::
    insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)pLVar7,__first_00,__last_00);
    FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp:175:9)>
    ::operator++((FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>
                  *)&__end3.predicate_.this);
  }
  __end3_1 = Loop::begin((Loop *)blocks_in_loop.end_.predicate_.this);
  inner_loop = (Loop *)Loop::end((Loop *)this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end3_1,
                            (__normal_iterator<spvtools::opt::Loop_*const_*,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                             *)&inner_loop), bVar2) {
    ppLVar8 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Loop_*const_*,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
              ::operator*(&__end3_1);
    live_inout_1 = (RegionRegisterLiveness *)*ppLVar8;
    pRVar1 = this->reg_pressure_;
    pBVar4 = Loop::GetHeaderBlock((Loop *)live_inout_1);
    pRVar5 = RegisterLiveness::Get(pRVar1,pBVar4);
    local_1f8 = pRVar5;
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
    ::begin(&local_218,
            (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
             *)local_d0);
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
    ::end(&local_238,
          (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
           *)local_d0);
    __first_01.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_218.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_01.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_218.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_01.predicate_.context_ = local_218.predicate_.context_;
    __first_01.predicate_.bb_ = local_218.predicate_.bb_;
    __last_01.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_238.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last_01.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_238.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last_01.predicate_.context_ = local_238.predicate_.context_;
    __last_01.predicate_.bb_ = local_238.predicate_.bb_;
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::
    insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)pRVar5,__first_01,__last_01);
    pLVar7 = &local_1f8->live_out_;
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
    ::begin(&local_258,
            (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
             *)local_d0);
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
    ::end(&local_278,
          (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>_>
           *)local_d0);
    __first_02.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_258.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_02.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_258.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_02.predicate_.context_ = local_258.predicate_.context_;
    __first_02.predicate_.bb_ = local_258.predicate_.bb_;
    __last_02.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_278.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last_02.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_278.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last_02.predicate_.context_ = local_278.predicate_.context_;
    __last_02.predicate_.bb_ = local_278.predicate_.bb_;
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::
    insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)pLVar7,__first_02,__last_02);
    DoLoopLivenessUnification(this,(Loop *)live_inout_1);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Loop_*const_*,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
    ::operator++(&__end3_1);
  }
  return;
}

Assistant:

void DoLoopLivenessUnification(const Loop& loop) {
    auto blocks_in_loop = MakeFilterIteratorRange(
        loop.GetBlocks().begin(), loop.GetBlocks().end(),
        [&loop, this](uint32_t bb_id) {
          return bb_id != loop.GetHeaderBlock()->id() &&
                 loop_desc_[bb_id] == &loop;
        });

    RegisterLiveness::RegionRegisterLiveness* header_live_inout =
        reg_pressure_->Get(loop.GetHeaderBlock());
    assert(header_live_inout &&
           "Liveness analysis was not performed for the current block");

    ExcludePhiDefinedInBlock predicate(context_, loop.GetHeaderBlock());
    auto live_loop =
        MakeFilterIteratorRange(header_live_inout->live_in_.begin(),
                                header_live_inout->live_in_.end(), predicate);

    for (uint32_t bb_id : blocks_in_loop) {
      BasicBlock* bb = cfg_.block(bb_id);

      RegisterLiveness::RegionRegisterLiveness* live_inout =
          reg_pressure_->Get(bb);
      live_inout->live_in_.insert(live_loop.begin(), live_loop.end());
      live_inout->live_out_.insert(live_loop.begin(), live_loop.end());
    }

    for (const Loop* inner_loop : loop) {
      RegisterLiveness::RegionRegisterLiveness* live_inout =
          reg_pressure_->Get(inner_loop->GetHeaderBlock());
      live_inout->live_in_.insert(live_loop.begin(), live_loop.end());
      live_inout->live_out_.insert(live_loop.begin(), live_loop.end());

      DoLoopLivenessUnification(*inner_loop);
    }
  }